

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O1

logic_t slang::condWildcardEqual(SVInt *lhs,SVInt *rhs)

{
  bool bVar1;
  uint uVar2;
  uint64_t *puVar3;
  SVInt *pSVar4;
  logic_t lVar5;
  ulong uVar6;
  byte bVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_28;
  uint local_20;
  byte local_1b;
  
  if ((rhs->super_SVIntStorage).unknownFlag == false) {
    lVar5 = SVInt::operator==(lhs,rhs);
    return (logic_t)lVar5.value;
  }
  uVar8 = (lhs->super_SVIntStorage).bitWidth;
  uVar2 = (rhs->super_SVIntStorage).bitWidth;
  if (uVar8 == uVar2) {
    lVar5.value = '\x01';
    if (0x3f < uVar2 + 0x3f) {
      puVar3 = (rhs->super_SVIntStorage).field_0.pVal;
      bVar1 = (lhs->super_SVIntStorage).unknownFlag;
      pSVar4 = (SVInt *)(lhs->super_SVIntStorage).field_0.val;
      if (bVar1 != false) {
        lhs = pSVar4;
      }
      if (0x40 < uVar8) {
        lhs = pSVar4;
      }
      uVar8 = uVar2 + 0x3f >> 6;
      uVar6 = (ulong)(uVar8 << 3);
      lVar9 = 0;
      do {
        uVar10 = ~*(ulong *)((long)puVar3 + lVar9 * 8 + uVar6);
        if ((bVar1 != false) &&
           ((*(ulong *)((long)&(pSVar4->super_SVIntStorage).field_0 + lVar9 * 8 + uVar6) & uVar10)
            != 0)) {
          return (logic_t)0x80;
        }
        if (((puVar3[lVar9] ^ (&(lhs->super_SVIntStorage).field_0)[lVar9].val) & uVar10) != 0) {
          return (logic_t)'\0';
        }
        lVar9 = lVar9 + 1;
      } while (uVar8 != (uint)lVar9);
    }
  }
  else {
    bVar7 = (rhs->super_SVIntStorage).signFlag & (lhs->super_SVIntStorage).signFlag;
    if (uVar8 < uVar2) {
      if (bVar7 == 0) {
        SVInt::zext((SVInt *)&local_28,(bitwidth_t)lhs);
      }
      else {
        SVInt::sext((SVInt *)&local_28,(bitwidth_t)lhs);
      }
      lVar5 = condWildcardEqual((SVInt *)&local_28,rhs);
    }
    else {
      if (bVar7 == 0) {
        SVInt::zext((SVInt *)&local_28,(bitwidth_t)rhs);
      }
      else {
        SVInt::sext((SVInt *)&local_28,(bitwidth_t)rhs);
      }
      lVar5 = condWildcardEqual(lhs,(SVInt *)&local_28);
    }
    if (((0x40 < local_20) || ((local_1b & 1) != 0)) && ((void *)local_28.val != (void *)0x0)) {
      operator_delete__(local_28.pVal);
    }
  }
  return (logic_t)lVar5.value;
}

Assistant:

logic_t condWildcardEqual(const SVInt& lhs, const SVInt& rhs) {
    // if no unknown flags, do normal comparison
    if (!rhs.unknownFlag)
        return lhs == rhs;

    // handle sign extension if necessary
    if (lhs.bitWidth != rhs.bitWidth) {
        bool bothSigned = lhs.signFlag && rhs.signFlag;
        if (lhs.bitWidth < rhs.bitWidth)
            return condWildcardEqual(lhs.extend(rhs.bitWidth, bothSigned), rhs);
        else
            return condWildcardEqual(lhs, rhs.extend(lhs.bitWidth, bothSigned));
    }

    uint32_t words = SVInt::getNumWords(rhs.bitWidth, false);
    for (uint32_t i = 0; i < words; ++i) {
        // bitmask to avoid comparing the bits unknown on the rhs
        uint64_t mask = ~rhs.pVal[i + words];
        if (lhs.unknownFlag && (lhs.getRawData()[i + words] & mask) != 0)
            return logic_t::x;

        if ((lhs.getRawData()[i] & mask) != (rhs.pVal[i] & mask))
            return logic_t(false);
    }

    return logic_t(true);
}